

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_differencer_unittest.cc
# Opt level: O3

void __thiscall
google::protobuf::anon_unknown_0::MessageDifferencerTest_IgnoreField_InsideSet_Test::TestBody
          (MessageDifferencerTest_IgnoreField_InsideSet_Test *this)

{
  void *pvVar1;
  FieldDescriptor *field;
  FieldDescriptor *field_00;
  Arena *pAVar2;
  string_view value;
  string_view value_00;
  string_view value_01;
  string_view value_02;
  MessageDifferencer differencer;
  TestDiffMessage msg1;
  TestDiffMessage msg2;
  undefined1 local_338 [16];
  Message local_328 [26];
  undefined1 local_188 [184];
  undefined1 local_d0 [184];
  
  proto2_unittest::TestDiffMessage::TestDiffMessage((TestDiffMessage *)local_188,(Arena *)0x0);
  proto2_unittest::TestDiffMessage::TestDiffMessage((TestDiffMessage *)local_d0,(Arena *)0x0);
  pvVar1 = protobuf::internal::RepeatedPtrFieldBase::AddMessageLite
                     ((RepeatedPtrFieldBase *)(local_188 + 0x30),
                      Arena::DefaultConstruct<proto2_unittest::TestDiffMessage_Item>);
  *(undefined4 *)((long)pvVar1 + 0x98) = 1;
  *(byte *)((long)pvVar1 + 0x10) = *(byte *)((long)pvVar1 + 0x10) | 5;
  pAVar2 = *(Arena **)((long)pvVar1 + 8);
  if (((ulong)pAVar2 & 1) != 0) {
    pAVar2 = *(Arena **)((ulong)pAVar2 & 0xfffffffffffffffe);
  }
  value._M_str = "foo";
  value._M_len = 3;
  protobuf::internal::ArenaStringPtr::Set((ArenaStringPtr *)((long)pvVar1 + 0x88),value,pAVar2);
  RepeatedField<int>::Add((RepeatedField<int> *)((long)pvVar1 + 0x18),1);
  pvVar1 = protobuf::internal::RepeatedPtrFieldBase::AddMessageLite
                     ((RepeatedPtrFieldBase *)(local_188 + 0x30),
                      Arena::DefaultConstruct<proto2_unittest::TestDiffMessage_Item>);
  *(undefined4 *)((long)pvVar1 + 0x98) = 2;
  *(byte *)((long)pvVar1 + 0x10) = *(byte *)((long)pvVar1 + 0x10) | 5;
  pAVar2 = *(Arena **)((long)pvVar1 + 8);
  if (((ulong)pAVar2 & 1) != 0) {
    pAVar2 = *(Arena **)((ulong)pAVar2 & 0xfffffffffffffffe);
  }
  value_00._M_str = "bar";
  value_00._M_len = 3;
  protobuf::internal::ArenaStringPtr::Set((ArenaStringPtr *)((long)pvVar1 + 0x88),value_00,pAVar2);
  RepeatedField<int>::Add((RepeatedField<int> *)((long)pvVar1 + 0x18),2);
  pvVar1 = protobuf::internal::RepeatedPtrFieldBase::AddMessageLite
                     ((RepeatedPtrFieldBase *)(local_d0 + 0x30),
                      Arena::DefaultConstruct<proto2_unittest::TestDiffMessage_Item>);
  *(undefined4 *)((long)pvVar1 + 0x98) = 2;
  *(byte *)((long)pvVar1 + 0x10) = *(byte *)((long)pvVar1 + 0x10) | 5;
  pAVar2 = *(Arena **)((long)pvVar1 + 8);
  if (((ulong)pAVar2 & 1) != 0) {
    pAVar2 = *(Arena **)((ulong)pAVar2 & 0xfffffffffffffffe);
  }
  value_01._M_str = "bar";
  value_01._M_len = 3;
  protobuf::internal::ArenaStringPtr::Set((ArenaStringPtr *)((long)pvVar1 + 0x88),value_01,pAVar2);
  RepeatedField<int>::Add((RepeatedField<int> *)((long)pvVar1 + 0x18),2);
  pvVar1 = protobuf::internal::RepeatedPtrFieldBase::AddMessageLite
                     ((RepeatedPtrFieldBase *)(local_d0 + 0x30),
                      Arena::DefaultConstruct<proto2_unittest::TestDiffMessage_Item>);
  *(undefined4 *)((long)pvVar1 + 0x98) = 1;
  *(byte *)((long)pvVar1 + 0x10) = *(byte *)((long)pvVar1 + 0x10) | 5;
  pAVar2 = *(Arena **)((long)pvVar1 + 8);
  if (((ulong)pAVar2 & 1) != 0) {
    pAVar2 = *(Arena **)((ulong)pAVar2 & 0xfffffffffffffffe);
  }
  value_02._M_str = "baz";
  value_02._M_len = 3;
  protobuf::internal::ArenaStringPtr::Set((ArenaStringPtr *)((long)pvVar1 + 0x88),value_02,pAVar2);
  RepeatedField<int>::Add((RepeatedField<int> *)((long)pvVar1 + 0x18),1);
  local_338._0_8_ = local_328;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_338,"item","");
  field = GetFieldDescriptor((anon_unknown_0 *)local_188,(Message *)local_338._0_8_,
                             (string *)local_338._8_8_);
  if ((Message *)local_338._0_8_ != local_328) {
    operator_delete((void *)local_338._0_8_,
                    (long)local_328[0].super_MessageLite._vptr_MessageLite + 1);
  }
  local_338._0_8_ = local_328;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_338,"item.b","");
  field_00 = GetFieldDescriptor((anon_unknown_0 *)local_188,(Message *)local_338._0_8_,
                                (string *)local_338._8_8_);
  if ((Message *)local_338._0_8_ != local_328) {
    operator_delete((void *)local_338._0_8_,
                    (long)local_328[0].super_MessageLite._vptr_MessageLite + 1);
  }
  util::MessageDifferencer::MessageDifferencer((MessageDifferencer *)local_338);
  util::MessageDifferencer::IgnoreField((MessageDifferencer *)local_338,field_00);
  util::MessageDifferencer::TreatAsSet((MessageDifferencer *)local_338,field);
  ExpectEqualsWithDifferencer
            ((MessageDifferencer *)local_338,(Message *)local_188,(Message *)local_d0);
  util::MessageDifferencer::~MessageDifferencer((MessageDifferencer *)local_338);
  proto2_unittest::TestDiffMessage::~TestDiffMessage((TestDiffMessage *)local_d0);
  proto2_unittest::TestDiffMessage::~TestDiffMessage((TestDiffMessage *)local_188);
  return;
}

Assistant:

TEST(MessageDifferencerTest, IgnoreField_InsideSet) {
  proto2_unittest::TestDiffMessage msg1;
  proto2_unittest::TestDiffMessage msg2;

  proto2_unittest::TestDiffMessage::Item* item;

  item = msg1.add_item();
  item->set_a(1);
  item->set_b("foo");
  item->add_ra(1);

  item = msg1.add_item();
  item->set_a(2);
  item->set_b("bar");
  item->add_ra(2);

  item = msg2.add_item();
  item->set_a(2);
  item->set_b("bar");
  item->add_ra(2);

  item = msg2.add_item();
  item->set_a(1);
  item->set_b("baz");
  item->add_ra(1);

  const FieldDescriptor* item_desc = GetFieldDescriptor(msg1, "item");
  const FieldDescriptor* b = GetFieldDescriptor(msg1, "item.b");

  util::MessageDifferencer differencer;
  differencer.IgnoreField(b);
  differencer.TreatAsSet(item_desc);

  ExpectEqualsWithDifferencer(&differencer, msg1, msg2);
}